

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeCube>_>::ForcePrepareIntPtIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeCube>_> *this)

{
  int iVar1;
  int iVar2;
  TPZMaterial *pTVar3;
  long *plVar4;
  ostream *poVar5;
  TPZIntPoints *pTVar6;
  long *plVar7;
  TPZIntelGen<pzshape::TPZShapeCube> *in_RDI;
  int int_ind_1;
  int int_ind;
  int64_t point_index;
  int intrulepoints;
  TPZIntPoints *intrule;
  TPZMatWithMemBase *matWithMem;
  TPZMaterial *material;
  TPZCompEl *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar8;
  TPZManVector<long,_128> *in_stack_ffffffffffffffd0;
  long lVar9;
  long lVar10;
  
  pTVar3 = TPZCompEl::Material(in_stack_ffffffffffffffb0);
  if ((pTVar3 == (TPZMaterial *)0x0) ||
     (plVar4 = (long *)__dynamic_cast(pTVar3,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                      0xfffffffffffffffe), plVar4 == (long *)0x0)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar5 = std::operator<<(poVar5,
                             "virtual void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeCube>>::ForcePrepareIntPtIndices() [TBASE = TPZCompElH1<pzshape::TPZShapeCube>]"
                            );
    std::operator<<(poVar5," this->Material() == NULL\n");
  }
  else {
    iVar1 = (**(code **)(*(long *)&(in_RDI->super_TPZInterpolatedElement).
                                   super_TPZInterpolationSpace.super_TPZCompEl + 0x180))();
    if (iVar1 != 0) {
      pTVar6 = TPZIntelGen<pzshape::TPZShapeCube>::GetIntegrationRule(in_RDI);
      iVar1 = (*pTVar6->_vptr_TPZIntPoints[3])();
      TPZManVector<long,_128>::Resize
                (in_stack_ffffffffffffffd0,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (((gSinglePointMemory & 1U) == 0) || (iVar1 < 1)) {
        for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
          iVar8 = (**(code **)(*plVar4 + 0x58))(plVar4,0xffffffff);
          plVar7 = TPZVec<long>::operator[]
                             ((TPZVec<long> *)&in_RDI[3].fIntRule.fOrdZeta,(long)iVar2);
          *plVar7 = (long)iVar8;
        }
      }
      else {
        iVar2 = (**(code **)(*plVar4 + 0x58))(plVar4,0xffffffff);
        lVar9 = (long)iVar2;
        for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
          lVar10 = lVar9;
          plVar4 = TPZVec<long>::operator[]
                             ((TPZVec<long> *)&in_RDI[3].fIntRule.fOrdZeta,(long)iVar8);
          *plVar4 = lVar9;
          lVar9 = lVar10;
        }
      }
    }
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ForcePrepareIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if(!material || !matWithMem){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    if (this->NumberOfCompElementsInsideThisCompEl() == 0) {
        // This is suposed to happen if in the constructor of a multiphysics element. The CompEl vector is only initialized after the autobuild
        return;
    }
    
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    
    fIntPtIndices.Resize(intrulepoints);
    
    if(gSinglePointMemory && intrulepoints > 0)
    {
        int64_t point_index = matWithMem->PushMemItem();
#ifdef PZDEBUG
        if(point_index < 0)
        {
            std::cout << __PRETTY_FUNCTION__ << " material has no memory interface\n";
        }
#endif
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = point_index;
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
    }
    else
    {
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = matWithMem->PushMemItem();
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
          //entries in the related pzmatwithmem for further use.
    }
    
}